

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Gia_ManBmcAddCnf(Bmc_Mna_t *p,Gia_Man_t *pGia,Vec_Int_t *vIns,Vec_Int_t *vNodes,
                     Vec_Int_t *vOuts)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_01;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Vec_Int_t *p_02;
  long lVar8;
  long lVar9;
  
  p_00 = Gia_ManBmcDupCone(pGia,vIns,vNodes,vOuts);
  pAig = Gia_ManToAigSimple(p_00);
  p_01 = Cnf_Derive(pAig,pAig->nObjs[3]);
  pVVar5 = Vec_IntAlloc(p_01->nVars - (vIns->nSize + vOuts->nSize));
  for (lVar8 = 0; lVar8 < p_00->nObjs; lVar8 = lVar8 + 1) {
    pGVar6 = Gia_ManObj(p_00,(int)lVar8);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
       (-1 < p_01->pVarNums[lVar8])) {
      iVar1 = Vec_IntEntry(vNodes,~vIns->nSize + (int)lVar8);
      Vec_IntPush(pVVar5,iVar1);
    }
  }
  iVar1 = Gia_ManBmcAssignVarIds(p,vIns,pVVar5,vOuts);
  Vec_IntFree(pVVar5);
  pVVar5 = Vec_IntStartFull(p_01->nVars);
  if (*p_01->pVarNums < 1) {
    __assert_fail("pCnf->pVarNums[0] > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                  ,0x206,
                  "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Vec_IntWriteEntry(pVVar5,*p_01->pVarNums,iVar1);
  lVar8 = 1;
  iVar1 = 0;
  while ((lVar8 < p_00->nObjs && (pGVar6 = Gia_ManObj(p_00,(int)lVar8), pGVar6 != (Gia_Obj_t *)0x0))
        ) {
    if (-1 < p_01->pVarNums[lVar8]) {
      if (p_01->nVars <= p_01->pVarNums[lVar8]) {
        __assert_fail("pCnf->pVarNums[i] >= 0 && pCnf->pVarNums[i] < pCnf->nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                      ,0x20c,
                      "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar2 = (uint)*(ulong *)pGVar6;
      p_02 = vIns;
      iVar3 = iVar1;
      if ((~uVar2 & 0x9fffffff) != 0) {
        uVar7 = *(ulong *)pGVar6 & 0x1fffffff;
        if (uVar7 == 0x1fffffff || (int)uVar2 < 0) {
          if ((-1 < (int)uVar2) || ((int)uVar7 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                          ,0x213,
                          "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          p_02 = vOuts;
          iVar3 = iVar1 - (vNodes->nSize + vIns->nSize);
        }
        else {
          p_02 = vNodes;
          iVar3 = iVar1 - vIns->nSize;
        }
      }
      iVar3 = Vec_IntEntry(p_02,iVar3);
      iVar4 = Vec_IntEntry(p->vId2Var,iVar3);
      if (iVar4 < 1) {
        __assert_fail("Vec_IntEntry(p->vId2Var, iObj) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                      ,0x214,
                      "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar4 = p_01->pVarNums[lVar8];
      iVar3 = Vec_IntEntry(p->vId2Var,iVar3);
      Vec_IntWriteEntry(pVVar5,iVar4,iVar3);
    }
    lVar8 = lVar8 + 1;
    iVar1 = iVar1 + 1;
  }
  for (lVar8 = 0; lVar8 < p_01->nLiterals; lVar8 = lVar8 + 1) {
    iVar1 = (*p_01->pClauses)[lVar8];
    if ((iVar1 < 2) || (p_01->nVars * 2 <= iVar1)) {
      __assert_fail("pCnf->pClauses[0][i] > 1 && pCnf->pClauses[0][i] < 2 * pCnf->nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0x21b,
                    "void Gia_ManBmcAddCnf(Bmc_Mna_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Abc_Lit2LitV(pVVar5->pArray,iVar1);
    (*p_01->pClauses)[lVar8] = iVar1;
  }
  Vec_IntFree(pVVar5);
  lVar8 = 0;
  do {
    lVar9 = lVar8;
    iVar1 = p_01->nClauses;
    if (iVar1 <= lVar9) goto LAB_0044f672;
    iVar1 = sat_solver_addclause(p->pSat,p_01->pClauses[lVar9],p_01->pClauses[lVar9 + 1]);
    lVar8 = lVar9 + 1;
  } while (iVar1 != 0);
  iVar1 = p_01->nClauses;
LAB_0044f672:
  if ((int)lVar9 < iVar1) {
    puts("SAT solver became UNSAT after adding clauses.");
  }
  Aig_ManStop(pAig);
  Cnf_DataFree(p_01);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManBmcAddCnf( Bmc_Mna_t * p, Gia_Man_t * pGia, Vec_Int_t * vIns, Vec_Int_t * vNodes, Vec_Int_t * vOuts )
{
    Gia_Man_t * pNew = Gia_ManBmcDupCone( pGia, vIns, vNodes, vOuts );
    Aig_Man_t * pAig = Gia_ManToAigSimple( pNew );
    Cnf_Dat_t * pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Vec_Int_t * vUsed, * vMap;
    Gia_Obj_t * pObj;
    int i, iObj, VarC0;
    // collect used variables
    vUsed = Vec_IntAlloc( pCnf->nVars - Vec_IntSize(vIns) - Vec_IntSize(vOuts) );
    Gia_ManForEachAnd( pNew, pObj, i )
        if ( pCnf->pVarNums[i] >= 0 )
            Vec_IntPush( vUsed, Vec_IntEntry(vNodes, i - Vec_IntSize(vIns) - 1) );
    // assign variable IDs
    VarC0 = Gia_ManBmcAssignVarIds( p, vIns, vUsed, vOuts );
    Vec_IntFree( vUsed );
    // create variable map from CNF vars into SAT vars
    vMap = Vec_IntStartFull( pCnf->nVars );
    assert( pCnf->pVarNums[0] > 0 );
    Vec_IntWriteEntry( vMap, pCnf->pVarNums[0], VarC0 );
    Gia_ManForEachObj1( pNew, pObj, i )
    {
        if ( pCnf->pVarNums[i] < 0 )
            continue;
        assert( pCnf->pVarNums[i] >= 0 && pCnf->pVarNums[i] < pCnf->nVars );
        if ( Gia_ObjIsCi(pObj) )
            iObj = Vec_IntEntry( vIns, i - 1 );
        else if ( Gia_ObjIsAnd(pObj) )
            iObj = Vec_IntEntry( vNodes, i - Vec_IntSize(vIns) - 1 );
        else if ( Gia_ObjIsCo(pObj) )
            iObj = Vec_IntEntry( vOuts, i - Vec_IntSize(vIns) - Vec_IntSize(vNodes) - 1 );
        else assert( 0 );
        assert( Vec_IntEntry(p->vId2Var, iObj) > 0 );
        Vec_IntWriteEntry( vMap, pCnf->pVarNums[i], Vec_IntEntry(p->vId2Var, iObj) );
    }
//Vec_IntPrint( vMap );
    // remap CNF
    for ( i = 0; i < pCnf->nLiterals; i++ )
    {
        assert( pCnf->pClauses[0][i] > 1 && pCnf->pClauses[0][i] < 2 * pCnf->nVars );
        pCnf->pClauses[0][i] = Abc_Lit2LitV( Vec_IntArray(vMap), pCnf->pClauses[0][i] );
    }
    Vec_IntFree( vMap );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
/*
        int v;
        for ( v = 0; v < pCnf->pClauses[i+1] - pCnf->pClauses[i]; v++ )
            printf( "%d ", pCnf->pClauses[i][v] );
        printf( "\n" );
*/
        if ( !sat_solver_addclause( p->pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            break;
    }
    if ( i < pCnf->nClauses )
        printf( "SAT solver became UNSAT after adding clauses.\n" );
    Aig_ManStop( pAig );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pNew );
}